

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetEnumPath_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          EnumDescriptor *enum_descriptor)

{
  Descriptor *in_R8;
  string sStack_38;
  
  GetPrefix_abi_cxx11_
            (&sStack_38,this,(GeneratorOptions *)(options->output_dir).field_2._M_allocated_capacity
             ,*(FileDescriptor **)((long)&(options->output_dir).field_2 + 8),in_R8);
  std::operator+(__return_storage_ptr__,&sStack_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (options->output_dir)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string GetEnumPath(const GeneratorOptions& options,
                   const EnumDescriptor* enum_descriptor) {
  return GetPrefix(
      options, enum_descriptor->file(),
      enum_descriptor->containing_type()) + enum_descriptor->name();
}